

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

void djb::xyz_to_theta_phi(vec3 *wi,float_t *theta,float_t *phi)

{
  float fVar1;
  
  fVar1 = wi->z;
  if (fVar1 <= 0.99999) {
    if (-0.99999 <= fVar1) {
      fVar1 = acosf(fVar1);
      *theta = fVar1;
      fVar1 = atan2f(wi->y,wi->x);
      *phi = fVar1;
    }
    else {
      *theta = 3.1415927;
      *phi = 0.0;
    }
  }
  else {
    *phi = 0.0;
    *theta = 0.0;
  }
  return;
}

Assistant:

static void xyz_to_theta_phi(const vec3 &wi, float_t *theta, float_t *phi)
{
	if (wi.z > (float_t)0.99999) {
		(*theta) = (*phi) = 0.0;
	} else if (wi.z < (float_t)-0.99999) {
		(*theta) = m_pi();
		(*phi) = 0.0;
	} else {
		(*theta) = acos(wi.z);
		(*phi) = atan2(wi.y, wi.x);
	}
}